

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void ossl_trace(int direction,int ssl_ver,int content_type,void *buf,size_t len,SSL *ssl,void *userp
               )

{
  char *pcVar1;
  int iVar2;
  curl_infotype type;
  long local_488;
  int local_47c;
  int txt_len;
  int msg_type;
  char ssl_buf [1024];
  char *tls_rt_name;
  char *msg_name;
  char unknown [32];
  Curl_easy *data;
  Curl_cfilter *cf;
  char *verstr;
  SSL *ssl_local;
  size_t len_local;
  void *buf_local;
  int content_type_local;
  int ssl_ver_local;
  int direction_local;
  
  cf = (Curl_cfilter *)0x1cb0d6;
  if (userp != (void *)0x0) {
    if (userp == (void *)0x0) {
      local_488 = 0;
    }
    else {
      local_488 = *(long *)(*(long *)((long)userp + 0x10) + 0x48);
    }
    unknown[0x18] = (undefined1)local_488;
    unknown[0x19] = local_488._1_1_;
    unknown[0x1a] = local_488._2_1_;
    unknown[0x1b] = local_488._3_1_;
    unknown[0x1c] = local_488._4_1_;
    unknown[0x1d] = local_488._5_1_;
    unknown[0x1e] = local_488._6_1_;
    unknown[0x1f] = local_488._7_1_;
    if (((local_488 != 0) && (*(long *)(local_488 + 0x220) != 0)) &&
       ((direction == 0 || (direction == 1)))) {
      if (ssl_ver != 0) {
        if (ssl_ver == 2) {
          cf = (Curl_cfilter *)anon_var_dwarf_163a68;
        }
        else if (ssl_ver == 0x300) {
          cf = (Curl_cfilter *)anon_var_dwarf_163a73;
        }
        else if (ssl_ver == 0x301) {
          cf = (Curl_cfilter *)anon_var_dwarf_163a7e;
        }
        else if (ssl_ver == 0x302) {
          cf = (Curl_cfilter *)anon_var_dwarf_163a89;
        }
        else if (ssl_ver == 0x303) {
          cf = (Curl_cfilter *)anon_var_dwarf_163a94;
        }
        else if (ssl_ver == 0x304) {
          cf = (Curl_cfilter *)anon_var_dwarf_163a9f;
        }
        else {
          curl_msnprintf((char *)&msg_name,0x20,"(%x)",(ulong)(uint)ssl_ver);
          cf = (Curl_cfilter *)&msg_name;
        }
      }
      if (((ssl_ver != 0) && (content_type != 0x100)) && (content_type != 0x101)) {
        if ((ssl_ver >> 8 == 3) && (content_type != 0)) {
          ssl_buf._1016_8_ = tls_rt_type(content_type);
        }
        else {
          ssl_buf._1016_8_ = (long)"n,a=%s,\x01host=%s\x01port=%ld\x01auth=Bearer %s\x01\x01" + 0x29
          ;
        }
        if (content_type == 0x14) {
          local_47c = (int)*buf;
          tls_rt_name = "Change cipher spec";
        }
        else if (content_type == 0x15) {
          local_47c = *buf * 0x100 + (int)*(char *)((long)buf + 1);
          tls_rt_name = SSL_alert_desc_string_long(local_47c);
        }
        else {
          local_47c = (int)*buf;
          tls_rt_name = ssl_msg_type(ssl_ver >> 8,local_47c);
        }
        pcVar1 = "EEEE AAAAGAIN";
        if (direction != 0) {
          pcVar1 = "CONNECTTIMEOUT";
        }
        iVar2 = curl_msnprintf((char *)&txt_len,0x400,"%s (%s), %s, %s (%d):\n",cf,pcVar1 + 0xb,
                               ssl_buf._1016_8_,tls_rt_name,local_47c);
        Curl_debug((Curl_easy *)unknown._24_8_,CURLINFO_TEXT,(char *)&txt_len,(long)iVar2);
      }
      type = CURLINFO_SSL_DATA_IN;
      if (direction == 1) {
        type = CURLINFO_SSL_DATA_OUT;
      }
      Curl_debug((Curl_easy *)unknown._24_8_,type,(char *)buf,len);
    }
  }
  return;
}

Assistant:

static void ossl_trace(int direction, int ssl_ver, int content_type,
                       const void *buf, size_t len, SSL *ssl,
                       void *userp)
{
  const char *verstr = "???";
  struct Curl_cfilter *cf = userp;
  struct Curl_easy *data = NULL;
  char unknown[32];

  if(!cf)
    return;
  data = CF_DATA_CURRENT(cf);
  if(!data || !data->set.fdebug || (direction && direction != 1))
    return;

  switch(ssl_ver) {
#ifdef SSL2_VERSION /* removed in recent versions */
  case SSL2_VERSION:
    verstr = "SSLv2";
    break;
#endif
#ifdef SSL3_VERSION
  case SSL3_VERSION:
    verstr = "SSLv3";
    break;
#endif
  case TLS1_VERSION:
    verstr = "TLSv1.0";
    break;
#ifdef TLS1_1_VERSION
  case TLS1_1_VERSION:
    verstr = "TLSv1.1";
    break;
#endif
#ifdef TLS1_2_VERSION
  case TLS1_2_VERSION:
    verstr = "TLSv1.2";
    break;
#endif
#ifdef TLS1_3_VERSION
  case TLS1_3_VERSION:
    verstr = "TLSv1.3";
    break;
#endif
  case 0:
    break;
  default:
    msnprintf(unknown, sizeof(unknown), "(%x)", ssl_ver);
    verstr = unknown;
    break;
  }

  /* Log progress for interesting records only (like Handshake or Alert), skip
   * all raw record headers (content_type == SSL3_RT_HEADER or ssl_ver == 0).
   * For TLS 1.3, skip notification of the decrypted inner Content-Type.
   */
  if(ssl_ver
#ifdef SSL3_RT_HEADER
     && content_type != SSL3_RT_HEADER
#endif
#ifdef SSL3_RT_INNER_CONTENT_TYPE
     && content_type != SSL3_RT_INNER_CONTENT_TYPE
#endif
    ) {
    const char *msg_name, *tls_rt_name;
    char ssl_buf[1024];
    int msg_type, txt_len;

    /* the info given when the version is zero is not that useful for us */

    ssl_ver >>= 8; /* check the upper 8 bits only below */

    /* SSLv2 does not seem to have TLS record-type headers, so OpenSSL
     * always pass-up content-type as 0. But the interesting message-type
     * is at 'buf[0]'.
     */
    if(ssl_ver == SSL3_VERSION_MAJOR && content_type)
      tls_rt_name = tls_rt_type(content_type);
    else
      tls_rt_name = "";

    if(content_type == SSL3_RT_CHANGE_CIPHER_SPEC) {
      msg_type = *(const char *)buf;
      msg_name = "Change cipher spec";
    }
    else if(content_type == SSL3_RT_ALERT) {
      msg_type = (((const char *)buf)[0] << 8) + ((const char *)buf)[1];
      msg_name = SSL_alert_desc_string_long(msg_type);
    }
    else {
      msg_type = *(const char *)buf;
      msg_name = ssl_msg_type(ssl_ver, msg_type);
    }

    txt_len = msnprintf(ssl_buf, sizeof(ssl_buf),
                        "%s (%s), %s, %s (%d):\n",
                        verstr, direction ? "OUT" : "IN",
                        tls_rt_name, msg_name, msg_type);
    Curl_debug(data, CURLINFO_TEXT, ssl_buf, (size_t)txt_len);
  }

  Curl_debug(data, (direction == 1) ? CURLINFO_SSL_DATA_OUT :
             CURLINFO_SSL_DATA_IN, (const char *)buf, len);
  (void) ssl;
}